

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::calcLastPos(RBBITableBuilder *this,RBBINode *n)

{
  NodeType NVar1;
  RBBINode *pRVar2;
  
  if (n == (RBBINode *)0x0) {
    return;
  }
  if (n->fType - leafChar < 4) {
    UVector::addElement(n->fLastPosSet,n,this->fStatus);
    return;
  }
  calcLastPos(this,n->fLeftChild);
  calcLastPos(this,n->fRightChild);
  NVar1 = n->fType;
  if (2 < NVar1 - opStar) {
    if (NVar1 != opCat) {
      if (NVar1 != opOr) {
        return;
      }
      setAdd(this,n->fLastPosSet,n->fLeftChild->fLastPosSet);
      pRVar2 = n->fRightChild;
      goto LAB_002ae53e;
    }
    setAdd(this,n->fLastPosSet,n->fRightChild->fLastPosSet);
    if (n->fRightChild->fNullable == '\0') {
      return;
    }
  }
  pRVar2 = n->fLeftChild;
LAB_002ae53e:
  setAdd(this,n->fLastPosSet,pRVar2->fLastPosSet);
  return;
}

Assistant:

void RBBITableBuilder::calcLastPos(RBBINode *n) {
    if (n == NULL) {
        return;
    }
    if (n->fType == RBBINode::leafChar  ||
        n->fType == RBBINode::endMark   ||
        n->fType == RBBINode::lookAhead ||
        n->fType == RBBINode::tag) {
        // These are non-empty leaf node types.
        // Note: In order to maintain the sort invariant on the set,
        // this function should only be called on a node whose set is
        // empty to start with.
        n->fLastPosSet->addElement(n, *fStatus);
        return;
    }

    // The node is not a leaf.
    //  Calculate lastPos on its children.
    calcLastPos(n->fLeftChild);
    calcLastPos(n->fRightChild);

    // Apply functions from table 3.40 in Aho
    if (n->fType == RBBINode::opOr) {
        setAdd(n->fLastPosSet, n->fLeftChild->fLastPosSet);
        setAdd(n->fLastPosSet, n->fRightChild->fLastPosSet);
    }
    else if (n->fType == RBBINode::opCat) {
        setAdd(n->fLastPosSet, n->fRightChild->fLastPosSet);
        if (n->fRightChild->fNullable) {
            setAdd(n->fLastPosSet, n->fLeftChild->fLastPosSet);
        }
    }
    else if (n->fType == RBBINode::opStar     ||
             n->fType == RBBINode::opQuestion ||
             n->fType == RBBINode::opPlus) {
        setAdd(n->fLastPosSet, n->fLeftChild->fLastPosSet);
    }
}